

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> * __thiscall
pbrt::ParameterDictionary::GetSpectrumArray
          (ParameterDictionary *this,string *name,SpectrumType spectrumType,Allocator alloc)

{
  bool bVar1;
  const_iterator ppPVar2;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RSI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  ParsedParameter *p;
  const_iterator __end1;
  const_iterator __begin1;
  ParsedParameterVector *__range1;
  vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> *s;
  SpectrumType in_stack_00000234;
  ParsedParameter *in_stack_00000238;
  ParameterDictionary *in_stack_00000240;
  Allocator in_stack_00000248;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *this_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar3;
  const_iterator local_38;
  
  this_00 = in_RDI;
  local_38 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             ::begin(in_RSI);
  ppPVar2 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
            ::end(this_00);
  do {
    if (local_38 == ppPVar2) {
      memset(in_RDI,0,0x18);
      std::vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_>::vector
                ((vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> *)0x4de196);
      return (vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> *)this_00;
    }
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_RDI);
    if (!bVar1) {
      extractSpectrumArray(in_stack_00000240,in_stack_00000238,in_stack_00000234,in_stack_00000248);
      bVar1 = std::vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_>::empty
                        ((vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      uVar3 = (uint)!bVar1;
      if (bVar1) {
        std::vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_>::~vector
                  ((vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> *)
                   (ulong)CONCAT14(!bVar1,in_stack_ffffffffffffffa0));
      }
      if (uVar3 != 0) {
        return (vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> *)this_00;
      }
      in_stack_ffffffffffffffa4 = 0;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

std::vector<Spectrum> ParameterDictionary::GetSpectrumArray(const std::string &name,
                                                            SpectrumType spectrumType,
                                                            Allocator alloc) const {
    for (const ParsedParameter *p : params) {
        if (p->name != name)
            continue;

        std::vector<Spectrum> s = extractSpectrumArray(*p, spectrumType, alloc);
        if (!s.empty())
            return s;
    }
    return {};
}